

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

VMapEntry *
FindEntry<Assimp::LWO::WeightChannel>
          (vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_> *list,
          string *name,bool perPoly)

{
  bool bVar1;
  __type _Var2;
  Logger *this;
  VMapEntry *pVVar3;
  VMapEntry *p;
  WeightChannel local_b8;
  VMapEntry *local_48;
  WeightChannel *elem;
  iterator __end0;
  iterator __begin0;
  vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_> *__range1;
  bool perPoly_local;
  string *name_local;
  vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_> *list_local;
  
  __end0 = std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::
           begin(list);
  elem = (WeightChannel *)
         std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::end
                   (list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
                                *)&elem);
    if (!bVar1) {
      Assimp::LWO::WeightChannel::WeightChannel(&local_b8);
      std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::
      push_back(list,&local_b8);
      Assimp::LWO::WeightChannel::~WeightChannel(&local_b8);
      pVVar3 = &std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                ::back(list)->super_VMapEntry;
      std::__cxx11::string::operator=((string *)&pVVar3->name,(string *)name);
      return pVVar3;
    }
    local_48 = &__gnu_cxx::
                __normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
                ::operator*(&__end0)->super_VMapEntry;
    _Var2 = std::operator==(&local_48->name,name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
    ::operator++(&__end0);
  }
  if (!perPoly) {
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::warn(this,"LWO2: Found two VMAP sections with equal names");
  }
  return local_48;
}

Assistant:

VMapEntry* FindEntry(std::vector< T >& list,const std::string& name, bool perPoly)
{
    for (auto & elem : list)   {
        if (elem.name == name) {
            if (!perPoly)   {
                ASSIMP_LOG_WARN("LWO2: Found two VMAP sections with equal names");
            }
            return &elem;
        }
    }
    list.push_back( T() );
    VMapEntry* p = &list.back();
    p->name = name;
    return p;
}